

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_proxy_set(JSContext *ctx,JSValue obj,JSAtom atom,JSValue value,JSValue receiver,int flags)

{
  JSStackFrame *pJVar1;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  JSProxyData *pJVar5;
  char *fmt;
  JSValueUnion JVar6;
  JSRefCountHeader *p;
  JSValue JVar7;
  JSValue JVar8;
  JSValue method;
  JSPropertyDescriptor desc;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValue local_68;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar6 = value.u;
  pJVar5 = get_proxy_method(ctx,&method,obj,0x42);
  if (pJVar5 == (JSProxyData *)0x0) {
    return -1;
  }
  if ((int)method.tag == 3) {
    if (0xfffffff4 < (uint)value.tag) {
      *(int *)JVar6.ptr = *JVar6.ptr + 1;
    }
    iVar2 = JS_SetPropertyGeneric(ctx,pJVar5->target,atom,value,receiver,flags);
    return iVar2;
  }
  JVar7 = JS_AtomToValue(ctx,atom);
  if ((int)JVar7.tag == 6) {
    JVar7.tag = method.tag;
    JVar7.u.float64 = method.u.float64;
    JS_FreeValue(ctx,JVar7);
  }
  else {
    local_78.ptr = *(void **)&(pJVar5->target).u;
    iStack_70 = (pJVar5->target).tag;
    local_48 = receiver.u;
    iStack_40 = receiver.tag;
    JVar8.tag = method.tag;
    JVar8.u.float64 = method.u.float64;
    local_68 = JVar7;
    local_58 = JVar6;
    local_50 = value.tag;
    JVar8 = JS_CallFree(ctx,JVar8,pJVar5->handler,4,(JSValue *)&local_78);
    JS_FreeValue(ctx,JVar7);
    if ((int)JVar8.tag != 6) {
      iVar2 = JS_ToBoolFree(ctx,JVar8);
      if (iVar2 == 0) {
        if (((uint)flags >> 0xe & 1) == 0) {
          if (-1 < (short)flags) {
            return 0;
          }
          pJVar1 = ctx->rt->current_stack_frame;
          if (pJVar1 == (JSStackFrame *)0x0) {
            return 0;
          }
          if ((pJVar1->js_mode & 1) == 0) {
            return 0;
          }
        }
        fmt = "proxy: cannot set property";
      }
      else {
        iVar3 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)(pJVar5->target).u.ptr,atom);
        if (iVar3 < 0) {
          return -1;
        }
        if (iVar3 == 0) {
          return iVar2;
        }
        if ((desc.flags & 0x13U) == 0) {
          BVar4 = js_same_value(ctx,desc.value,value);
          if (BVar4 != 0) goto LAB_0013ae1d;
        }
        else if (((desc.flags & 0x11U) != 0x10) || ((int)desc.setter.tag != 3)) {
LAB_0013ae1d:
          js_free_desc(ctx,&desc);
          return iVar2;
        }
        js_free_desc(ctx,&desc);
        fmt = "proxy: inconsistent set";
      }
      JS_ThrowTypeError(ctx,fmt);
    }
  }
  return -1;
}

Assistant:

static int js_proxy_set(JSContext *ctx, JSValueConst obj, JSAtom atom,
                        JSValueConst value, JSValueConst receiver, int flags)
{
    JSProxyData *s;
    JSValue method, ret1, atom_val;
    int ret, res;
    JSValueConst args[4];

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_set);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_SetPropertyGeneric(ctx, s->target, atom,
                                     JS_DupValue(ctx, value), receiver,
                                     flags);
    }
    atom_val = JS_AtomToValue(ctx, atom);
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    args[2] = value;
    args[3] = receiver;
    ret1 = JS_CallFree(ctx, method, s->handler, 4, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (ret) {
        JSPropertyDescriptor desc;
        res = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(s->target), atom);
        if (res < 0)
            return -1;
        if (res) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0) {
                if (!js_same_value(ctx, desc.value, value)) {
                    goto fail;
                }
            } else if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE)) == JS_PROP_GETSET && JS_IsUndefined(desc.setter)) {
                fail:
                    js_free_desc(ctx, &desc);
                    JS_ThrowTypeError(ctx, "proxy: inconsistent set");
                    return -1;
            }
            js_free_desc(ctx, &desc);
        }
    } else {
        if ((flags & JS_PROP_THROW) ||
            ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
            JS_ThrowTypeError(ctx, "proxy: cannot set property");
            return -1;
        }
    }
    return ret;
}